

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_MeshInterface.cpp
# Opt level: O0

bool __thiscall
Opcode::MeshInterface::RemapClient(MeshInterface *this,udword nb_indices,udword *permutation)

{
  udword uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *local_98;
  IndexedTriangle *T_1;
  udword i_1;
  IndexedTriangle *T;
  udword i;
  udword Stride;
  IndexedTriangle *Tmp;
  udword *permutation_local;
  udword nb_indices_local;
  MeshInterface *this_local;
  
  if ((nb_indices == 0) || (permutation == (udword *)0x0)) {
    this_local._7_1_ = false;
  }
  else if (nb_indices == this->mNbTris) {
    uVar3 = CONCAT44(0,this->mNbTris);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0xc),0);
    uVar10 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar10 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar10);
    *puVar5 = uVar3;
    puVar9 = puVar5 + 1;
    if (uVar3 != 0) {
      local_98 = puVar9;
      do {
        local_98 = (ulong *)((long)local_98 + 0xc);
      } while (local_98 != (ulong *)((long)puVar9 + uVar3 * 0xc));
    }
    if (puVar9 == (ulong *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      uVar1 = this->mTriStride;
      for (T._4_4_ = 0; T._4_4_ < this->mNbTris; T._4_4_ = T._4_4_ + 1) {
        puVar6 = (undefined8 *)((long)this->mTris->mVRef + (ulong)(T._4_4_ * uVar1));
        puVar7 = (undefined8 *)((long)puVar9 + (ulong)T._4_4_ * 0xc);
        *puVar7 = *puVar6;
        *(undefined4 *)(puVar7 + 1) = *(undefined4 *)(puVar6 + 1);
      }
      for (T_1._4_4_ = 0; T_1._4_4_ < this->mNbTris; T_1._4_4_ = T_1._4_4_ + 1) {
        puVar6 = (undefined8 *)((long)this->mTris->mVRef + (ulong)(T_1._4_4_ * uVar1));
        puVar7 = (undefined8 *)((long)puVar9 + (ulong)permutation[T_1._4_4_] * 0xc);
        *puVar6 = *puVar7;
        *(undefined4 *)(puVar6 + 1) = *(undefined4 *)(puVar7 + 1);
      }
      if ((puVar9 != (ulong *)0x0) && (puVar9 != (ulong *)0x0)) {
        for (puVar8 = (ulong *)((long)puVar9 + *puVar5 * 0xc); puVar9 != puVar8;
            puVar8 = (ulong *)((long)puVar8 + -0xc)) {
        }
        operator_delete__(puVar5,*puVar5 * 0xc + 8);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MeshInterface::RemapClient(udword nb_indices, const udword* permutation) const
{
	// Checkings
	if(!nb_indices || !permutation)	return false;
	if(nb_indices!=mNbTris)			return false;

#ifdef OPC_USE_CALLBACKS
	// We can't really do that using callbacks
	return false;
#else
	IndexedTriangle* Tmp = new IndexedTriangle[mNbTris];
	CHECKALLOC(Tmp);

	#ifdef OPC_USE_STRIDE
	udword Stride = mTriStride;
	#else
	udword Stride = sizeof(IndexedTriangle);
	#endif

	for(udword i=0;i<mNbTris;i++)
	{
		const IndexedTriangle* T = (const IndexedTriangle*)(((ubyte*)mTris) + i * Stride);
		Tmp[i] = *T;
	}

	for(udword i=0;i<mNbTris;i++)
	{
		IndexedTriangle* T = (IndexedTriangle*)(((ubyte*)mTris) + i * Stride);
		*T = Tmp[permutation[i]];
	}

	DELETEARRAY(Tmp);
#endif
	return true;
}